

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

string * __thiscall
libcellml::Importer::ImporterImpl::resolvingUrl_abi_cxx11_
          (string *__return_storage_ptr__,ImporterImpl *this,ImportSourcePtr *importSource)

{
  bool bVar1;
  element_type *this_00;
  ModelPtr model;
  ImportSourcePtr *importSource_local;
  ImporterImpl *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)importSource;
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)importSource);
  ImportSource::model((ImportSource *)&stack0xffffffffffffffd0);
  bVar1 = std::operator==((shared_ptr<libcellml::Model> *)&stack0xffffffffffffffd0,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
    ImportSource::url_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  else {
    modelUrl_abi_cxx11_(__return_storage_ptr__,this,(ModelPtr *)&stack0xffffffffffffffd0);
  }
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)&stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

std::string Importer::ImporterImpl::resolvingUrl(const ImportSourcePtr &importSource) const
{
    auto model = importSource->model();
    if (model == nullptr) {
        return importSource->url();
    }

    return modelUrl(model);
}